

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_benchmark.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  reference __rhs;
  ostream *poVar4;
  istream *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fb8;
  undefined1 local_ef8 [8];
  fstream output_file;
  ostream local_ee8 [512];
  duration<long,_std::ratio<1L,_1000000000L>_> local_ce8;
  rep local_ce0;
  rep time_elapsed_ns_find;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_cd0;
  time_point time_point_after_find;
  time_point time_point_before_find;
  stringstream ss_1;
  undefined1 local_b38 [8];
  string line_1;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_b10;
  int line_number_1;
  duration<long,_std::ratio<1L,_1000000000L>_> time_diff_find;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  ifstream local_aa8 [520];
  stringstream local_8a0 [8];
  stringstream ss;
  undefined1 local_718 [8];
  string line;
  undefined1 local_6f0 [4];
  int line_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  long local_650;
  ifstream input_file;
  int local_444;
  int i;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  AVLTree<int> avlTree;
  allocator<char> local_408;
  allocator<char> local_407;
  allocator<char> local_406;
  allocator<char> local_405;
  allocator<char> local_404;
  allocator<char> local_403;
  allocator<char> local_402;
  allocator<char> local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  iterator local_2b8;
  size_type local_2b0;
  undefined1 local_2a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ofstream output_file1;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string path;
  
  path.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_30,&kDatasetPath,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_88,&kProjectPath,&local_89);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,"/benchmark/result/findResults.csv");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::ofstream::ofstream
            (&files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_68,_S_out);
  std::ofstream::close();
  avlTree.root._5_1_ = 1;
  local_400 = &local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"100",&local_401);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"500",&local_402);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"1000",&local_403);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"5000",&local_404);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"10000",&local_405);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"50000",&local_406);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"100000",&local_407);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"500000",&local_408);
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"1000000",(allocator<char> *)((long)&avlTree.root + 7));
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"5000000",(allocator<char> *)((long)&avlTree.root + 6));
  avlTree.root._5_1_ = 0;
  local_2b8 = &local_3f8;
  local_2b0 = 10;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&avlTree.root + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l._M_len = local_2b0;
  __l._M_array = local_2b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2a8,__l,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&avlTree.root + 4));
  local_fb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8;
  do {
    local_fb8 = local_fb8 + -1;
    std::__cxx11::string::~string((string *)local_fb8);
  } while (local_fb8 != &local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&avlTree.root + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&avlTree.root + 7));
  std::allocator<char>::~allocator(&local_408);
  std::allocator<char>::~allocator(&local_407);
  std::allocator<char>::~allocator(&local_406);
  std::allocator<char>::~allocator(&local_405);
  std::allocator<char>::~allocator(&local_404);
  std::allocator<char>::~allocator(&local_403);
  std::allocator<char>::~allocator(&local_402);
  std::allocator<char>::~allocator(&local_401);
  itis::AVLTree<int>::AVLTree((AVLTree<int> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2a8);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2a8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&file), bVar1) {
    __rhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    for (local_444 = 1; local_444 < 0xb; local_444 = local_444 + 1) {
      std::operator+(&local_6b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/");
      std::operator+(&local_690,&local_6b0,__rhs);
      std::operator+(&local_670,&local_690,".csv");
      std::ifstream::ifstream(&local_650,(string *)&local_670,_S_in);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/");
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
                     __rhs);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_6d0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)local_6f0);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_650 + *(long *)(local_650 + -0x18)));
      if (bVar1) {
        line.field_2._12_4_ = 0;
        std::__cxx11::string::string((string *)local_718);
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_650,(string *)local_718,',');
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if (!bVar1) break;
          _Var2 = std::operator|(_S_out,_S_in);
          std::__cxx11::stringstream::stringstream(local_8a0,(string *)local_718,_Var2);
          iVar3 = std::__cxx11::stoi((string *)local_718,(size_t *)0x0,10);
          itis::AVLTree<int>::insert((AVLTree<int> *)&__range1,iVar3);
          line.field_2._12_4_ = line.field_2._12_4_ + 1;
          std::__cxx11::stringstream::~stringstream(local_8a0);
        }
        std::__cxx11::string::~string((string *)local_718);
      }
      std::ifstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_diff_find,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/");
      std::operator+(&local_ae8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_diff_find,__rhs);
      std::operator+(&local_ac8,&local_ae8,".csv");
      std::ifstream::ifstream(local_aa8,(string *)&local_ac8,_S_in);
      std::ifstream::operator=(&local_650,local_aa8);
      std::ifstream::~ifstream(local_aa8);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::__cxx11::string::~string((string *)&time_diff_find);
      dStack_b10.__r = 0;
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_650 + *(long *)(local_650 + -0x18)));
      if (bVar1) {
        line_1.field_2._12_4_ = 0;
        std::__cxx11::string::string((string *)local_b38);
        while( true ) {
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_650,(string *)local_b38,',');
          bVar1 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if (!bVar1) break;
          _Var2 = std::operator|(_S_out,_S_in);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&time_point_before_find,(string *)local_b38,_Var2);
          time_point_after_find.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          iVar3 = std::__cxx11::stoi((string *)local_b38,(size_t *)0x0,10);
          itis::AVLTree<int>::find((AVLTree<int> *)&__range1,iVar3);
          local_cd0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          line_1.field_2._12_4_ = line_1.field_2._12_4_ + 1;
          time_elapsed_ns_find = (rep)std::chrono::operator-(&local_cd0,&time_point_after_find);
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    (&stack0xfffffffffffff4f0,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)&time_elapsed_ns_find);
          std::__cxx11::stringstream::~stringstream((stringstream *)&time_point_before_find);
        }
        std::__cxx11::string::~string((string *)local_b38);
      }
      local_ce8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          (&stack0xfffffffffffff4f0);
      local_ce0 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_ce8);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_ce0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      itis::AVLTree<int>::clear((AVLTree<int> *)&__range1);
      std::ifstream::close();
      std::fstream::fstream(local_ef8,(string *)local_68,_S_app);
      poVar4 = std::operator<<(local_ee8,(string *)__rhs);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_444);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_ce0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::fstream::close();
      std::fstream::~fstream(local_ef8);
      std::ifstream::~ifstream(&local_650);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  path.field_2._12_4_ = 0;
  itis::AVLTree<int>::~AVLTree((AVLTree<int> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8);
  std::ofstream::~ofstream
            (&files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return path.field_2._12_4_;
}

Assistant:

int main() {
  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/findResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;

  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      cout << (path + "/" + file) << endl;

      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);  // оборачиваем строку в объект "поток"
          avlTree.insert(stoi(line));
          line_number++;
        }
      }
      input_file.close();

      input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_find = chrono::nanoseconds::zero();
      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_find = chrono::high_resolution_clock::now();
          avlTree.find(stoi(line));
          const auto time_point_after_find = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_find += time_point_after_find - time_point_before_find;
        }
      }

      const auto time_elapsed_ns_find = chrono::duration_cast<chrono::nanoseconds>(time_diff_find).count();
      cout << time_elapsed_ns_find << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = fstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_find << endl;
      output_file.close();
    }
  }
  return 0;
}